

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_3ec06::ImageManager::~ImageManager(ImageManager *this)

{
  pointer pIVar1;
  Image *pIVar2;
  pointer ppRVar3;
  CopyForm1 p_Var4;
  long lVar5;
  ulong uVar6;
  pointer ppCVar7;
  
  ppCVar7 = (this->_input).
            super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar7 !=
      (this->_input).
      super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      operator_delete(*ppCVar7);
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 !=
             (this->_input).
             super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppRVar3 = (this->_output).
            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_output).
      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppRVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pIVar1 = (this->_outputClone).
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = ppRVar3[uVar6]->data;
      p_Var4 = ImageTypeManager::convert(this->_registrator,(&pIVar1->_type)[lVar5],pIVar2->_type);
      (*p_Var4)((Image *)((long)&pIVar1->_vptr_ImageTemplate + lVar5),pIVar2);
      operator_delete((this->_output).
                      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6]);
      ppRVar3 = (this->_output).
                super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < (ulong)((long)(this->_output).
                                   super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3))
    ;
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_outputClone);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_inputClone);
  ppRVar3 = (this->_output).
            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar3 != (pointer)0x0) {
    operator_delete(ppRVar3);
  }
  ppCVar7 = (this->_input).
            super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar7 != (pointer)0x0) {
    operator_delete(ppCVar7);
    return;
  }
  return;
}

Assistant:

~ImageManager()
        {
            for ( std::vector<ConstReferenceOwner *>::iterator data = _input.begin(); data != _input.end(); ++data )
                delete *data;

            for ( size_t i = 0u; i < _output.size(); ++i ) {
                _restore( _outputClone[i], _output[i]->data );

                delete _output[i];
            }
        }